

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O2

uint * Amap_LibVerifyPerm_rec
                 (Amap_Lib_t *pLib,Amap_Nod_t *pNod,Vec_Ptr_t *vTtElems,Vec_Int_t *vTruth,int nWords
                 ,int *piInput)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  
  if ((*(uint *)pNod & 0xff000000) == 0x6000000) {
    __assert_fail("pNod->Type != AMAP_OBJ_MUX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0xf3,
                  "unsigned int *Amap_LibVerifyPerm_rec(Amap_Lib_t *, Amap_Nod_t *, Vec_Ptr_t *, Vec_Int_t *, int, int *)"
                 );
  }
  if ((short)*(uint *)pNod == 0) {
    iVar3 = *piInput;
    *piInput = iVar3 + 1;
    puVar4 = (uint *)Vec_PtrEntry(vTtElems,iVar3);
    return puVar4;
  }
  uVar1 = (ulong)(uint)nWords;
  uVar2 = Abc_Lit2Var((int)pNod->iFan0);
  puVar4 = Amap_LibVerifyPerm_rec(pLib,pLib->pNodes + uVar2,vTtElems,vTruth,nWords,piInput);
  uVar2 = Abc_Lit2Var((int)pNod->iFan1);
  puVar5 = Amap_LibVerifyPerm_rec(pLib,pLib->pNodes + uVar2,vTtElems,vTruth,nWords,piInput);
  if (nWords != 0) {
    if (nWords < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar7 = (long)nWords + (long)vTruth->nSize;
    iVar3 = (int)lVar7;
    vTruth->nSize = iVar3;
    if (iVar3 <= vTruth->nCap) {
      puVar8 = (uint *)(vTruth->pArray + (lVar7 - uVar1));
      goto LAB_00351346;
    }
  }
  puVar8 = (uint *)0x0;
LAB_00351346:
  if (pNod->field_0x3 == '\x05') {
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      puVar8[uVar6] = puVar5[uVar6] ^ puVar4[uVar6];
    }
  }
  else {
    iVar3 = Abc_LitIsCompl((int)pNod->iFan0);
    if ((iVar3 == 0) && (iVar3 = Abc_LitIsCompl((int)pNod->iFan1), iVar3 == 0)) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        puVar8[uVar6] = puVar5[uVar6] & puVar4[uVar6];
      }
      return puVar8;
    }
    iVar3 = Abc_LitIsCompl((int)pNod->iFan0);
    if ((iVar3 == 0) && (iVar3 = Abc_LitIsCompl((int)pNod->iFan1), iVar3 != 0)) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        puVar8[uVar6] = ~puVar5[uVar6] & puVar4[uVar6];
      }
      return puVar8;
    }
    iVar3 = Abc_LitIsCompl((int)pNod->iFan0);
    if ((iVar3 != 0) && (iVar3 = Abc_LitIsCompl((int)pNod->iFan1), iVar3 == 0)) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        puVar8[uVar6] = ~puVar4[uVar6] & puVar5[uVar6];
      }
      return puVar8;
    }
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      puVar8[uVar6] = ~(puVar5[uVar6] | puVar4[uVar6]);
    }
  }
  return puVar8;
}

Assistant:

unsigned * Amap_LibVerifyPerm_rec( Amap_Lib_t * pLib, Amap_Nod_t * pNod, 
    Vec_Ptr_t * vTtElems, Vec_Int_t * vTruth, int nWords, int * piInput )
{
    Amap_Nod_t * pFan0, * pFan1;
    unsigned * pTruth0, * pTruth1, * pTruth;
    int i;
    assert( pNod->Type != AMAP_OBJ_MUX );
    if ( pNod->Id == 0 )
        return (unsigned *)Vec_PtrEntry( vTtElems, (*piInput)++ );
    pFan0 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
    pTruth0 = Amap_LibVerifyPerm_rec( pLib, pFan0, vTtElems, vTruth, nWords, piInput );
    pFan1 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
    pTruth1 = Amap_LibVerifyPerm_rec( pLib, pFan1, vTtElems, vTruth, nWords, piInput );
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( pNod->Type == AMAP_OBJ_XOR )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Abc_LitIsCompl(pNod->iFan0) && !Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Abc_LitIsCompl(pNod->iFan0) && Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Abc_LitIsCompl(pNod->iFan0) && !Abc_LitIsCompl(pNod->iFan1) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Abc_LitIsCompl(pNod->iFan0) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    return pTruth;
}